

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_iflist.c
# Opt level: O0

csp_iface_t * csp_iflist_iterate(csp_iface_t *ifc)

{
  csp_iface_t *ifc_local;
  
  if (ifc == (csp_iface_t *)0x0) {
    ifc_local = interfaces;
  }
  else {
    ifc_local = ifc->next;
  }
  return ifc_local;
}

Assistant:

csp_iface_t * csp_iflist_iterate(csp_iface_t * ifc) {

	/* Head of list */
	if (ifc == NULL) {
		ifc = interfaces;

	/* Otherwise, continue from user defined ifc */
	} else {
		ifc = ifc->next;
	}

	return ifc;

}